

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastInst.hpp
# Opt level: O0

QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::Demodulation::Rhs> *
__thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::FastInstancesIterator::next
          (FastInstancesIterator *this)

{
  TypedTermList term;
  TypedTermList t;
  bool bVar1;
  Rhs *pRVar2;
  InstMatcher *in_RSI;
  TermList in_RDI;
  Renaming normalizer;
  bool ground;
  Rhs *ld;
  Renaming *in_stack_ffffffffffffff30;
  SmartPtr<Indexing::ResultSubstitution> *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 uVar3;
  SortId this_00;
  SmartPtr<Indexing::ResultSubstitution> local_a0;
  Rhs local_90;
  TypedTermList local_70;
  FastInstancesIterator *in_stack_ffffffffffffffa8;
  
  this_00._content = in_RDI._content;
  do {
    bVar1 = Lib::VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*>::hasNext
                      ((VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*> *)0x3d539f);
    uVar3 = false;
    if (!bVar1) {
      uVar3 = findNextLeaf(in_stack_ffffffffffffffa8);
    }
  } while ((bool)uVar3 != false);
  pRVar2 = Lib::VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*>::next
                     ((VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*> *)0x3d53d4);
  if (((in_RSI->_boundVars)._capacity & 1) == 0) {
    Lib::SmartPtr<Indexing::ResultSubstitution>::SmartPtr(&local_a0);
    QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::Demodulation::Rhs>::
    QueryRes((QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::Demodulation::Rhs>
              *)CONCAT17(uVar3,in_stack_ffffffffffffff40),in_stack_ffffffffffffff38,
             (Rhs *)in_stack_ffffffffffffff30);
    Lib::SmartPtr<Indexing::ResultSubstitution>::~SmartPtr
              ((SmartPtr<Indexing::ResultSubstitution> *)in_stack_ffffffffffffff30);
  }
  else {
    Kernel::Renaming::reset(in_stack_ffffffffffffff30);
    Inferences::ALASCA::Demodulation::Rhs::key(pRVar2);
    term._sort._content._0_7_ = in_stack_ffffffffffffff40;
    term.super_TermList._content = (uint64_t)in_stack_ffffffffffffff38;
    term._sort._content._7_1_ = uVar3;
    bVar1 = SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::isGround(term);
    if (!bVar1) {
      in_stack_ffffffffffffff38 = (SmartPtr<Indexing::ResultSubstitution> *)&stack0xffffffffffffffa0
      ;
      Kernel::Renaming::Renaming(in_stack_ffffffffffffff30);
      local_70 = Inferences::ALASCA::Demodulation::Rhs::key(pRVar2);
      t._sort._content = this_00._content;
      t.super_TermList._content = in_RDI._content;
      Kernel::Renaming::normalizeVariables((Renaming *)CONCAT17(uVar3,in_stack_ffffffffffffff40),t);
      Kernel::Renaming::makeInverse((Renaming *)this_00._content,(Renaming *)in_RDI._content);
      Kernel::Renaming::~Renaming((Renaming *)0x3d549e);
    }
    pRVar2 = &local_90;
    SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::getSubstitution
              (in_RSI,(Renaming *)this_00._content);
    QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::Demodulation::Rhs>::
    QueryRes((QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::Demodulation::Rhs>
              *)CONCAT17(uVar3,in_stack_ffffffffffffff40),in_stack_ffffffffffffff38,pRVar2);
    Lib::SmartPtr<Indexing::ResultSubstitution>::~SmartPtr
              ((SmartPtr<Indexing::ResultSubstitution> *)pRVar2);
  }
  return (QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::Demodulation::Rhs>
          *)(Renaming *)this_00._content;
}

Assistant:

QueryRes<ResultSubstitutionSP, LeafData_> SubstitutionTree<LeafData_>::FastInstancesIterator::next()
{
  while(!_ldIterator.hasNext() && findNextLeaf()) {}
  ASS(_ldIterator.hasNext());
  auto ld = _ldIterator.next();

  if(_retrieveSubstitution) {
    _resultDenormalizer.reset();
    bool ground = SubstitutionTree::isGround(ld->key());
    if(!ground) {
      Renaming normalizer;
      normalizer.normalizeVariables(ld->key());
      _resultDenormalizer.makeInverse(normalizer);
    }

    return QueryRes(_subst.getSubstitution(&_resultDenormalizer), ld);
  } else {
    return QueryRes(ResultSubstitutionSP(), ld);
  }
}